

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlation_suite.cpp
# Opt level: O0

void anscombe_quartet::anscombe_IV(void)

{
  close_to<double> predicate;
  double absolute_tolerance;
  double *in_stack_ffffffffffffff68;
  double local_80;
  value_type local_78;
  undefined1 local_70 [8];
  correlation<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.y_moment.sum,0.05,absolute_tolerance);
  trial::online::cumulative::correlation<double>::correlation((correlation<double> *)local_70);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,6.58);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,5.76);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,7.71);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,8.84);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,8.47);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,7.04);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,5.25);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,19.0,12.5);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,5.56);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,7.91);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,6.89);
  local_78 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70);
  local_80 = 0.816;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.816","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x8c,0x10447f,(char *)&local_78,&local_80,in_stack_ffffffffffffff68,predicate)
  ;
  return;
}

Assistant:

void anscombe_IV()
{
    const auto tolerance = detail::close_to<double>(5e-2);
    cumulative::correlation<double> filter;

    filter.push(8.0, 6.58);
    filter.push(8.0, 5.76);
    filter.push(8.0, 7.71);
    filter.push(8.0, 8.84);
    filter.push(8.0, 8.47);
    filter.push(8.0, 7.04);
    filter.push(8.0, 5.25);
    filter.push(19.0, 12.50);
    filter.push(8.0, 5.56);
    filter.push(8.0, 7.91);
    filter.push(8.0, 6.89);
    TRIAL_TEST_WITH(filter.value(), 0.816, tolerance);
}